

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O3

void crnlib::crnlib_free(void *p)

{
  if (p == (void *)0x0) {
    return;
  }
  if (((ulong)p & 0xf) != 0) {
    crnlib_assert("crnlib_free: bad ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_mem.cpp"
                  ,0xaa);
    return;
  }
  (*(code *)g_pRealloc)(p,0,0,1,g_pUser_data);
  return;
}

Assistant:

void crnlib_free(void* p)
    {
        if (!p)
        {
            return;
        }

        if (reinterpret_cast<ptr_bits_t>(p) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnlib_mem_error("crnlib_free: bad ptr");
            return;
        }

#if CRNLIB_MEM_STATS
        size_t cur_size = (*g_pMSize)(p, g_pUser_data);
        CRNLIB_ASSERT(cur_size >= sizeof(uint32));
        update_total_allocated(-1, -static_cast<mem_stat_t>(cur_size));
#endif

        (*g_pRealloc)(p, 0, nullptr, true, g_pUser_data);
    }